

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_wait_for_pa_stream_to_connect__pulse
                    (ma_context *pContext,ma_ptr pMainLoop,ma_ptr pStream)

{
  int iVar1;
  wchar_t result;
  ma_result mVar2;
  ma_log *pLog;
  ma_pa_stream_state_t state;
  wchar_t resultPA;
  ma_ptr pStream_local;
  ma_ptr pMainLoop_local;
  ma_context *pContext_local;
  
  while( true ) {
    iVar1 = (*(pContext->field_14).alsa.snd_pcm_get_chmap)(pStream);
    if (iVar1 == 2) {
      return MA_SUCCESS;
    }
    if ((iVar1 == 3) || (iVar1 == 4)) break;
    result = (*(pContext->field_14).alsa.snd_pcm_hw_params_set_format)(pMainLoop,1,0);
    if (result < L'\0') {
      mVar2 = ma_result_from_pulse(result);
      return mVar2;
    }
  }
  pLog = ma_context_get_log(pContext);
  ma_log_postf(pLog,1,"[PulseAudio] An error occurred while connecting the PulseAudio stream.");
  return MA_ERROR;
}

Assistant:

static ma_result ma_wait_for_pa_stream_to_connect__pulse(ma_context* pContext, ma_ptr pMainLoop, ma_ptr pStream)
{
    int resultPA;
    ma_pa_stream_state_t state;

    for (;;) {
        state = ((ma_pa_stream_get_state_proc)pContext->pulse.pa_stream_get_state)((ma_pa_stream*)pStream);
        if (state == MA_PA_STREAM_READY) {
            break;  /* Done. */
        }

        if (state == MA_PA_STREAM_FAILED || state == MA_PA_STREAM_TERMINATED) {
            ma_log_postf(ma_context_get_log(pContext), MA_LOG_LEVEL_ERROR, "[PulseAudio] An error occurred while connecting the PulseAudio stream.");
            return MA_ERROR;
        }

        resultPA = ((ma_pa_mainloop_iterate_proc)pContext->pulse.pa_mainloop_iterate)((ma_pa_mainloop*)pMainLoop, 1, NULL);
        if (resultPA < 0) {
            return ma_result_from_pulse(resultPA);
        }
    }

    return MA_SUCCESS;
}